

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

int __thiscall
cmMakefile::TryCompile
          (cmMakefile *this,string *srcdir,string *bindir,string *projectName,string *targetName,
          bool fast,int jobs,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *cmakeArgs,string *output)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  char *__rhs;
  string *psVar5;
  cmValue cVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_950;
  _Head_base<0UL,_cmGlobalGenerator_*,_false> local_930;
  undefined1 local_928 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_920;
  string *local_900;
  string *local_8f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8f0;
  cmWorkingDirectory workdir;
  cmake cm;
  
  this->IsSourceFileTryCompile = fast;
  local_900 = projectName;
  local_8f8 = targetName;
  bVar1 = cmsys::SystemTools::FileIsDirectory(bindir);
  if (!bVar1) {
    cmsys::SystemTools::MakeDirectory(bindir,(mode_t *)0x0);
  }
  cmWorkingDirectory::cmWorkingDirectory(&workdir,bindir);
  if (workdir.ResultCode != 0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_928 + 8),"Failed to set working directory to ",bindir);
    std::operator+(&local_950,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_928 + 8)," : ");
    __rhs = strerror(workdir.ResultCode);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&cm,
                   &local_950,__rhs);
    IssueMessage(this,FATAL_ERROR,(string *)&cm);
    std::__cxx11::string::~string((string *)&cm);
    std::__cxx11::string::~string((string *)&local_950);
    std::__cxx11::string::~string((string *)(local_928 + 8));
    cmSystemTools::s_FatalErrorOccurred = true;
    this->IsSourceFileTryCompile = false;
    iVar4 = 1;
    goto LAB_0024c963;
  }
  cmake::cmake(&cm,RoleProject,Project,TryCompile);
  (*this->GlobalGenerator->_vptr_cmGlobalGenerator[3])(&local_950);
  iVar4 = 1;
  cmake::CreateGlobalGenerator((cmake *)local_928,(string *)&cm,SUB81(&local_950,0));
  std::__cxx11::string::~string((string *)&local_950);
  if (local_928 == (undefined1  [8])0x0) {
    (*this->GlobalGenerator->_vptr_cmGlobalGenerator[3])(&local_8f0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_928 + 8),"Global generator \'",&local_8f0);
    std::operator+(&local_950,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_928 + 8),"\' could not be created.");
    IssueMessage(this,INTERNAL_ERROR,&local_950);
    std::__cxx11::string::~string((string *)&local_950);
    std::__cxx11::string::~string((string *)(local_928 + 8));
    this_00 = &local_8f0;
LAB_0024c930:
    std::__cxx11::string::~string((string *)this_00);
    cmSystemTools::s_FatalErrorOccurred = true;
  }
  else {
    *(int *)((long)local_928 + 0x30) = this->RecursionDepth;
    local_930._M_head_impl = (cmGlobalGenerator *)local_928;
    local_928 = (undefined1  [8])0x0;
    cmake::SetGlobalGenerator
              (&cm,(unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_> *)
                   &local_930);
    if (local_930._M_head_impl != (cmGlobalGenerator *)0x0) {
      (*(code *)(((__uniq_ptr_data<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>,_true,_true>
                   *)&(local_930._M_head_impl)->_vptr_cmGlobalGenerator)->
                super___uniq_ptr_impl<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>
                )._M_t.
                super__Tuple_impl<0UL,_cmGlobalGeneratorFactory_*,_std::default_delete<cmGlobalGeneratorFactory>_>
                .super__Head_base<0UL,_cmGlobalGeneratorFactory_*,_false>._M_head_impl[1].
                _vptr_cmGlobalGeneratorFactory)();
    }
    local_930._M_head_impl = (cmGlobalGenerator *)0x0;
    cmake::SetTraceRedirect(&cm,this->GlobalGenerator->CMakeInstance);
    cmake::SetHomeDirectory(&cm,srcdir);
    cmake::SetHomeOutputDirectory(&cm,bindir);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_950,"CMAKE_GENERATOR_INSTANCE",(allocator<char> *)(local_928 + 8));
    psVar5 = GetSafeDefinition(this,&local_950);
    cmake::SetGeneratorInstance(&cm,psVar5);
    std::__cxx11::string::~string((string *)&local_950);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_950,"CMAKE_GENERATOR_PLATFORM",(allocator<char> *)(local_928 + 8));
    psVar5 = GetSafeDefinition(this,&local_950);
    cmake::SetGeneratorPlatform(&cm,psVar5);
    std::__cxx11::string::~string((string *)&local_950);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_950,"CMAKE_GENERATOR_TOOLSET",(allocator<char> *)(local_928 + 8));
    psVar5 = GetSafeDefinition(this,&local_950);
    cmake::SetGeneratorToolset(&cm,psVar5);
    std::__cxx11::string::~string((string *)&local_950);
    cmake::LoadCache(&cm);
    cVar2 = (**(code **)(*(long *)cm.GlobalGenerator._M_t.
                                  super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>
                                  .super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl +
                        0x130))();
    if (cVar2 == '\0') {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_950,"CMAKE_TRY_COMPILE_CONFIGURATION",
                 (allocator<char> *)(local_928 + 8));
      cVar6 = GetDefinition(this,&local_950);
      std::__cxx11::string::~string((string *)&local_950);
      if (cVar6.Value != (string *)0x0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_950,"CMAKE_BUILD_TYPE",(allocator<char> *)(local_928 + 8));
        cmake::AddCacheEntry(&cm,&local_950,cVar6,"Build configuration",3);
        std::__cxx11::string::~string((string *)&local_950);
      }
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_950,"CMAKE_MAXIMUM_RECURSION_DEPTH",
               (allocator<char> *)(local_928 + 8));
    cVar6 = GetDefinition(this,&local_950);
    std::__cxx11::string::~string((string *)&local_950);
    if (cVar6.Value != (string *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_950,"CMAKE_MAXIMUM_RECURSION_DEPTH",
                 (allocator<char> *)(local_928 + 8));
      cmake::AddCacheEntry(&cm,&local_950,cVar6,"Maximum recursion depth",3);
      std::__cxx11::string::~string((string *)&local_950);
    }
    if (cmakeArgs !=
        (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)0x0) {
      cm.WarnUnusedCli = false;
      cmake::SetCacheArgs(&cm,cmakeArgs);
    }
    cmGlobalGenerator::EnableLanguagesFromGenerator
              ((cmGlobalGenerator *)
               cm.GlobalGenerator._M_t.
               super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>.
               _M_t.
               super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>.
               super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl,this->GlobalGenerator,
               this);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_950,"CMAKE_SUPPRESS_DEVELOPER_WARNINGS",
               (allocator<char> *)(local_928 + 8));
    bVar1 = IsOn(this,&local_950);
    std::__cxx11::string::~string((string *)&local_950);
    if (bVar1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_950,"CMAKE_SUPPRESS_DEVELOPER_WARNINGS",
                 (allocator<char> *)(local_928 + 8));
      cmake::AddCacheEntry(&cm,&local_950,"TRUE","",4);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_950,"CMAKE_SUPPRESS_DEVELOPER_WARNINGS",
                 (allocator<char> *)(local_928 + 8));
      cmake::AddCacheEntry(&cm,&local_950,"FALSE","",4);
    }
    std::__cxx11::string::~string((string *)&local_950);
    iVar3 = cmake::Configure(&cm);
    if (iVar3 != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_950,"Failed to configure test project build system.",
                 (allocator<char> *)(local_928 + 8));
      IssueMessage(this,FATAL_ERROR,&local_950);
LAB_0024c92b:
      this_00 = &local_950;
      goto LAB_0024c930;
    }
    iVar3 = cmake::Generate(&cm);
    if (iVar3 != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_950,"Failed to generate test project build system.",
                 (allocator<char> *)(local_928 + 8));
      IssueMessage(this,FATAL_ERROR,&local_950);
      goto LAB_0024c92b;
    }
    iVar4 = cmGlobalGenerator::TryCompile
                      (this->GlobalGenerator,jobs,srcdir,bindir,local_900,local_8f8,fast,output,this
                      );
  }
  this->IsSourceFileTryCompile = false;
  if (local_928 != (undefined1  [8])0x0) {
    (*(code *)(((__uniq_ptr_data<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>,_true,_true>
                 *)local_928)->
              super___uniq_ptr_impl<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>
              )._M_t.
              super__Tuple_impl<0UL,_cmGlobalGeneratorFactory_*,_std::default_delete<cmGlobalGeneratorFactory>_>
              .super__Head_base<0UL,_cmGlobalGeneratorFactory_*,_false>._M_head_impl[1].
              _vptr_cmGlobalGeneratorFactory)();
  }
  cmake::~cmake(&cm);
LAB_0024c963:
  cmWorkingDirectory::~cmWorkingDirectory(&workdir);
  return iVar4;
}

Assistant:

int cmMakefile::TryCompile(const std::string& srcdir,
                           const std::string& bindir,
                           const std::string& projectName,
                           const std::string& targetName, bool fast, int jobs,
                           const std::vector<std::string>* cmakeArgs,
                           std::string& output)
{
  this->IsSourceFileTryCompile = fast;
  // does the binary directory exist ? If not create it...
  if (!cmSystemTools::FileIsDirectory(bindir)) {
    cmSystemTools::MakeDirectory(bindir);
  }

  // change to the tests directory and run cmake
  // use the cmake object instead of calling cmake
  cmWorkingDirectory workdir(bindir);
  if (workdir.Failed()) {
    this->IssueMessage(MessageType::FATAL_ERROR,
                       "Failed to set working directory to " + bindir + " : " +
                         std::strerror(workdir.GetLastResult()));
    cmSystemTools::SetFatalErrorOccurred();
    this->IsSourceFileTryCompile = false;
    return 1;
  }

  // make sure the same generator is used
  // use this program as the cmake to be run, it should not
  // be run that way but the cmake object requires a vailid path
  cmake cm(cmake::RoleProject, cmState::Project,
           cmState::ProjectKind::TryCompile);
  auto gg = cm.CreateGlobalGenerator(this->GetGlobalGenerator()->GetName());
  if (!gg) {
    this->IssueMessage(MessageType::INTERNAL_ERROR,
                       "Global generator '" +
                         this->GetGlobalGenerator()->GetName() +
                         "' could not be created.");
    cmSystemTools::SetFatalErrorOccurred();
    this->IsSourceFileTryCompile = false;
    return 1;
  }
  gg->RecursionDepth = this->RecursionDepth;
  cm.SetGlobalGenerator(std::move(gg));

  // copy trace state
  cm.SetTraceRedirect(this->GetCMakeInstance());

  // do a configure
  cm.SetHomeDirectory(srcdir);
  cm.SetHomeOutputDirectory(bindir);
  cm.SetGeneratorInstance(this->GetSafeDefinition("CMAKE_GENERATOR_INSTANCE"));
  cm.SetGeneratorPlatform(this->GetSafeDefinition("CMAKE_GENERATOR_PLATFORM"));
  cm.SetGeneratorToolset(this->GetSafeDefinition("CMAKE_GENERATOR_TOOLSET"));
  cm.LoadCache();
  if (!cm.GetGlobalGenerator()->IsMultiConfig()) {
    if (cmValue config =
          this->GetDefinition("CMAKE_TRY_COMPILE_CONFIGURATION")) {
      // Tell the single-configuration generator which one to use.
      // Add this before the user-provided CMake arguments in case
      // one of the arguments is -DCMAKE_BUILD_TYPE=...
      cm.AddCacheEntry("CMAKE_BUILD_TYPE", config, "Build configuration",
                       cmStateEnums::STRING);
    }
  }
  cmValue recursionDepth =
    this->GetDefinition("CMAKE_MAXIMUM_RECURSION_DEPTH");
  if (recursionDepth) {
    cm.AddCacheEntry("CMAKE_MAXIMUM_RECURSION_DEPTH", recursionDepth,
                     "Maximum recursion depth", cmStateEnums::STRING);
  }
  // if cmake args were provided then pass them in
  if (cmakeArgs) {
    // FIXME: Workaround to ignore unused CLI variables in try-compile.
    //
    // Ideally we should use SetArgs for options like --no-warn-unused-cli.
    // However, there is a subtle problem when certain arguments are passed to
    // a macro wrapping around try_compile or try_run that does not escape
    // semicolons in its parameters but just passes ${ARGV} or ${ARGN}.  In
    // this case a list argument like "-DVAR=a;b" gets split into multiple
    // cmake arguments "-DVAR=a" and "b".  Currently SetCacheArgs ignores
    // argument "b" and uses just "-DVAR=a", leading to a subtle bug in that
    // the try_compile or try_run does not get the proper value of VAR.  If we
    // call SetArgs here then it would treat "b" as the source directory and
    // cause an error such as "The source directory .../CMakeFiles/CMakeTmp/b
    // does not exist", thus breaking the try_compile or try_run completely.
    //
    // Strictly speaking the bug is in the wrapper macro because the CMake
    // language has always flattened nested lists and the macro should escape
    // the semicolons in its arguments before forwarding them.  However, this
    // bug is so subtle that projects typically work anyway, usually because
    // the value VAR=a is sufficient for the try_compile or try_run to get the
    // correct result.  Calling SetArgs here would break such projects that
    // previously built.  Instead we work around the issue by never reporting
    // unused arguments and ignoring options such as --no-warn-unused-cli.
    cm.SetWarnUnusedCli(false);
    // cm.SetArgs(*cmakeArgs, true);

    cm.SetCacheArgs(*cmakeArgs);
  }
  // to save time we pass the EnableLanguage info directly
  cm.GetGlobalGenerator()->EnableLanguagesFromGenerator(
    this->GetGlobalGenerator(), this);
  if (this->IsOn("CMAKE_SUPPRESS_DEVELOPER_WARNINGS")) {
    cm.AddCacheEntry("CMAKE_SUPPRESS_DEVELOPER_WARNINGS", "TRUE", "",
                     cmStateEnums::INTERNAL);
  } else {
    cm.AddCacheEntry("CMAKE_SUPPRESS_DEVELOPER_WARNINGS", "FALSE", "",
                     cmStateEnums::INTERNAL);
  }
  if (cm.Configure() != 0) {
    this->IssueMessage(MessageType::FATAL_ERROR,
                       "Failed to configure test project build system.");
    cmSystemTools::SetFatalErrorOccurred();
    this->IsSourceFileTryCompile = false;
    return 1;
  }

  if (cm.Generate() != 0) {
    this->IssueMessage(MessageType::FATAL_ERROR,
                       "Failed to generate test project build system.");
    cmSystemTools::SetFatalErrorOccurred();
    this->IsSourceFileTryCompile = false;
    return 1;
  }

  // finally call the generator to actually build the resulting project
  int ret = this->GetGlobalGenerator()->TryCompile(
    jobs, srcdir, bindir, projectName, targetName, fast, output, this);

  this->IsSourceFileTryCompile = false;
  return ret;
}